

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11::detail::clear_instance(PyObject *self)

{
  instance *piVar1;
  PyTypeObject *pPVar2;
  size_t *psVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  size_t tinfo;
  byte bVar7;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var8;
  internals *piVar9;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> __it;
  undefined8 *puVar10;
  instance *this;
  bool bVar11;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar13;
  PyTypeObject *local_70;
  instance *local_68;
  instance *local_60;
  iterator __begin2;
  
  pPVar2 = self->ob_type;
  local_68 = (instance *)self;
  pVar12 = all_type_info_get_cache(pPVar2);
  _Var8 = pVar12.first.
          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
          ._M_cur;
  if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    all_type_info_populate
              (pPVar2,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)((long)_Var8.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                ._M_cur + 0x10));
  }
  __begin2.inst =
       (instance *)
       ((long)_Var8.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x10);
  local_60 = local_68;
  psVar3 = *(size_t **)
            ((long)_Var8.
                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                   ._M_cur + 0x18);
  if (*(size_t **)
       ((long)_Var8.
              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
              ._M_cur + 0x10) == psVar3) {
    __begin2.curr.index = 0;
  }
  else {
    __begin2.curr.index =
         **(size_t **)
           ((long)_Var8.
                  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                  ._M_cur + 0x10);
  }
  __begin2.types = (type_vec *)local_68;
  __begin2.curr.inst = (instance *)0x0;
  __begin2.curr.type = (type_info *)&local_68->field_1;
  if ((local_68->field_0x30 & 2) == 0) {
    __begin2.curr.type =
         (type_info *)((nonsimple_values_and_holders *)__begin2.curr.type)->values_and_holders;
  }
  lVar4 = ((__begin2.inst)->ob_base).ob_refcnt;
  this = local_68;
  do {
    tinfo = __begin2.curr.index;
    if (__begin2.curr.inst == (instance *)((long)psVar3 - lVar4 >> 3)) {
      instance::deallocate_layout(this);
      if (this->weakrefs != (PyObject *)0x0) {
        PyObject_ClearWeakRefs(this);
      }
      puVar10 = (undefined8 *)_PyObject_GetDictPtr(this);
      if ((puVar10 != (undefined8 *)0x0) && (plVar6 = (long *)*puVar10, plVar6 != (long *)0x0)) {
        *puVar10 = 0;
        *plVar6 = *plVar6 + -1;
        if (*plVar6 == 0) {
          _Py_Dealloc();
        }
      }
      if ((this->field_0x30 & 0x10) != 0) {
        clear_patients(&this->ob_base);
      }
      return;
    }
    pPVar2 = (__begin2.curr.type)->type;
    if (pPVar2 != (PyTypeObject *)0x0) {
      bVar7 = *(byte *)&__begin2.types[2].
                        super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      if ((bVar7 & 2) == 0) {
        bVar7 = *(byte *)((long)&((__begin2.curr.inst)->ob_base).ob_refcnt +
                         (long)__begin2.types[1].
                               super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 2;
      }
      else {
        bVar7 = bVar7 >> 3 & 1;
      }
      if (bVar7 != 0) {
        local_70 = pPVar2;
        piVar9 = get_internals();
        pVar13 = std::
                 _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&(piVar9->registered_instances)._M_h,&local_70);
        __it._M_cur = (__node_type *)
                      pVar13.first.
                      super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      ._M_cur;
        bVar11 = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                  )__it._M_cur !=
                 pVar13.second.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ;
        if (bVar11) {
          do {
            if ((local_68->ob_base).ob_type ==
                *(PyTypeObject **)(*(long *)((long)__it._M_cur + 0x10) + 8)) {
              std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
              ::erase(&(piVar9->registered_instances)._M_h,(const_iterator)__it._M_cur);
              bVar11 = true;
              break;
            }
            __it._M_cur = *__it._M_cur;
            bVar11 = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                      )__it._M_cur !=
                     pVar13.second.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
            ;
          } while (bVar11);
        }
        this = local_68;
        if ((*(byte *)(tinfo + 0x90) & 2) == 0) {
          traverse_offset_bases(pPVar2,(type_info *)tinfo,local_68,deregister_instance_impl);
        }
        if (!bVar11) {
          pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
      }
      if ((this->field_0x30 & 1) == 0) {
        bVar7 = *(byte *)&__begin2.types[2].
                          super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        if ((bVar7 & 2) == 0) {
          bVar7 = *(byte *)((long)&((__begin2.curr.inst)->ob_base).ob_refcnt +
                           (long)__begin2.types[1].
                                 super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          bVar7 = bVar7 >> 2;
        }
        if ((bVar7 & 1) == 0) goto LAB_00111037;
      }
      (**(code **)(__begin2.curr.index + 0x38))(&__begin2.types);
    }
LAB_00111037:
    if ((local_60->field_0x30 & 2) == 0) {
      __begin2.curr.type =
           (type_info *)
           (&(__begin2.curr.type)->cpptype +
           *(long *)(*(long *)(((__begin2.inst)->ob_base).ob_refcnt + (long)__begin2.curr.inst * 8)
                    + 0x20));
    }
    piVar1 = (instance *)((long)&((__begin2.curr.inst)->ob_base).ob_refcnt + 1);
    lVar5 = ((__begin2.inst)->ob_base).ob_refcnt;
    if (piVar1 < (instance *)((long)((__begin2.inst)->ob_base).ob_type - lVar5 >> 3)) {
      __begin2.curr.index = *(size_t *)(lVar5 + 8 + (long)__begin2.curr.inst * 8);
      __begin2.curr.inst = piVar1;
    }
    else {
      __begin2.curr.index = 0;
      __begin2.curr.inst = piVar1;
    }
  } while( true );
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}